

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.cpp
# Opt level: O0

void UnitTest::anon_unknown_1::CheckStringsEqual
               (TestResults *results,char *expected,char *actual,TestDetails *details)

{
  undefined8 test;
  int iVar1;
  ostream *poVar2;
  char *failure;
  undefined1 local_1c0 [8];
  MemoryOutStream stream;
  TestDetails *details_local;
  char *actual_local;
  char *expected_local;
  TestResults *results_local;
  
  stream._400_8_ = details;
  iVar1 = strcmp(expected,actual);
  if (iVar1 != 0) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    poVar2 = std::operator<<((ostream *)local_1c0,"Expected ");
    poVar2 = std::operator<<(poVar2,expected);
    poVar2 = std::operator<<(poVar2," but was ");
    std::operator<<(poVar2,actual);
    test = stream._400_8_;
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,(TestDetails *)test,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0);
  }
  return;
}

Assistant:

void CheckStringsEqual(TestResults& results, char const* expected, char const* actual, 
                       TestDetails const& details)
{
	using namespace std;

    if (strcmp(expected, actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}